

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O3

void __thiscall
FFTAnalyzer::AnalyzeOutput
          (FFTAnalyzer *this,float *data,int numchannels,int numsamples,float decaySpeed)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  UnityComplexNumber *pUVar5;
  float *pfVar6;
  float *pfVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  float fVar11;
  undefined1 auVar12 [16];
  
  CheckInitialized(this);
  uVar4 = this->spectrumSize;
  if (0 < (int)(uVar4 - numsamples)) {
    pfVar6 = this->obuffer;
    uVar9 = 0;
    do {
      pfVar6[uVar9] = pfVar6[(long)numsamples + uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar4 - numsamples != uVar9);
  }
  if (0 < numsamples) {
    pfVar6 = this->obuffer;
    uVar9 = (ulong)(uint)numsamples;
    iVar8 = uVar4 - numsamples;
    do {
      pfVar6[iVar8] = *data;
      data = data + numchannels;
      iVar8 = iVar8 + 1;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  pUVar5 = this->cspec;
  if (0 < (int)uVar4) {
    pfVar6 = this->window;
    pfVar7 = this->obuffer;
    uVar9 = 0;
    do {
      pUVar5[uVar9].re = pfVar7[uVar9] * pfVar6[uVar9];
      pUVar5[uVar9].im = 0.0;
      uVar9 = uVar9 + 1;
    } while (uVar4 != uVar9);
  }
  FFTProcess<double>(pUVar5,uVar4,true);
  uVar4 = this->spectrumSize;
  if ((int)uVar4 < 2) {
    pfVar6 = this->ospec1;
    pfVar7 = this->ospec2;
  }
  else {
    pUVar5 = this->cspec;
    pfVar6 = this->ospec1;
    pfVar7 = this->ospec2;
    uVar9 = 0;
    do {
      fVar11 = pUVar5[uVar9].re;
      fVar1 = pUVar5[uVar9].im;
      fVar11 = SQRT(fVar11 * fVar11 + fVar1 * fVar1);
      uVar10 = -(uint)(pfVar7[uVar9] < fVar11);
      pfVar6[uVar9] = (float)(~uVar10 & (uint)(pfVar7[uVar9] * decaySpeed) | (uint)fVar11 & uVar10);
      uVar9 = uVar9 + 1;
    } while (uVar4 >> 1 != uVar9);
  }
  uVar2 = this->ispec1;
  uVar3 = this->ispec2;
  auVar12._8_4_ = (int)uVar2;
  auVar12._0_8_ = uVar3;
  auVar12._12_4_ = (int)((ulong)uVar2 >> 0x20);
  this->ispec1 = (float *)uVar3;
  this->ispec2 = (float *)auVar12._8_8_;
  this->ospec1 = pfVar7;
  this->ospec2 = pfVar6;
  if (this->numSpectraReady < 2) {
    this->numSpectraReady = this->numSpectraReady + 1;
  }
  return;
}

Assistant:

void FFTAnalyzer::AnalyzeOutput(float* data, int numchannels, int numsamples, float decaySpeed)
{
    CheckInitialized();

    for (int n = 0; n < spectrumSize - numsamples; n++)
        obuffer[n] = obuffer[n + numsamples];
    for (int n = 0; n < numsamples; n++)
        obuffer[n + spectrumSize - numsamples] = data[n * numchannels];
    for (int n = 0; n < spectrumSize; n++)
        cspec[n].Set(obuffer[n] * window[n], 0.0f);
    Forward(cspec, spectrumSize, true);
    for (int n = 0; n < spectrumSize / 2; n++)
    {
        float a = cspec[n].Magnitude();
        ospec1[n] = (a > ospec2[n]) ? a : ospec2[n] * decaySpeed;
    }

    float* tmp;
    tmp = ispec1; ispec1 = ispec2; ispec2 = tmp;
    tmp = ospec1; ospec1 = ospec2; ospec2 = tmp;

    if (numSpectraReady < 2)
        numSpectraReady++;
}